

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

void __thiscall ELFIO::elfio::create_mandatory_sections(elfio *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  elf_header *peVar2;
  section *psVar3;
  string local_40;
  
  psVar3 = create_section(this);
  local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffffffff0000;
  (*psVar3->_vptr_section[0x23])(psVar3);
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  (*psVar3->_vptr_section[4])(psVar3,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffff00000000;
  (*psVar3->_vptr_section[0x16])(psVar3,&local_40);
  local_40._M_dataplus._M_p._0_2_ = 1;
  peVar2 = (this->header)._M_t.
           super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
           super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if (peVar2 != (elf_header *)0x0) {
    (*peVar2->_vptr_elf_header[0x21])(peVar2,&local_40);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".shstrtab","");
  psVar3 = Sections::add(&this->sections,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (*psVar3->_vptr_section[6])(psVar3,&SHT_STRTAB);
  local_40._M_dataplus._M_p = (pointer)0x1;
  (*psVar3->_vptr_section[0xe])(psVar3);
  return;
}

Assistant:

void create_mandatory_sections()
    {
        // Create null section without calling to 'add_section' as no string
        // section containing section names exists yet
        section* sec0 = create_section();
        sec0->set_index( 0 );
        sec0->set_name( "" );
        sec0->set_name_string_offset( 0 );

        set_section_name_str_index( 1 );
        section* shstrtab = sections.add( ".shstrtab" );
        shstrtab->set_type( SHT_STRTAB );
        shstrtab->set_addr_align( 1 );
    }